

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathSumFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr obj;
  xmlNodeSetPtr pxVar1;
  xmlXPathObjectPtr value;
  int iVar2;
  long lVar3;
  double val;
  double dVar4;
  int iStack_30;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueNr < 1) {
      iStack_30 = 0x17;
    }
    else {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) &&
         ((ctxt->value->type | XPATH_USERS) == XPATH_XSLT_TREE)) {
        obj = xmlXPathValuePop(ctxt);
        pxVar1 = obj->nodesetval;
        val = 0.0;
        if ((pxVar1 != (xmlNodeSetPtr)0x0) && (iVar2 = pxVar1->nodeNr, iVar2 != 0)) {
          for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
            dVar4 = xmlXPathNodeToNumberInternal(ctxt,pxVar1->nodeTab[lVar3]);
            val = val + dVar4;
            pxVar1 = obj->nodesetval;
            iVar2 = pxVar1->nodeNr;
          }
        }
        value = xmlXPathCacheNewFloat(ctxt,val);
        xmlXPathValuePush(ctxt,value);
        xmlXPathReleaseObject(ctxt->context,obj);
        return;
      }
      iStack_30 = 0xb;
    }
  }
  else {
    iStack_30 = 0xc;
  }
  xmlXPathErr(ctxt,iStack_30);
  return;
}

Assistant:

void
xmlXPathSumFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;
    int i;
    double res = 0.0;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_NODESET) &&
	 (ctxt->value->type != XPATH_XSLT_TREE)))
	XP_ERROR(XPATH_INVALID_TYPE);
    cur = xmlXPathValuePop(ctxt);

    if ((cur->nodesetval != NULL) && (cur->nodesetval->nodeNr != 0)) {
	for (i = 0; i < cur->nodesetval->nodeNr; i++) {
	    res += xmlXPathNodeToNumberInternal(ctxt,
                                                cur->nodesetval->nodeTab[i]);
	}
    }
    xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt, res));
    xmlXPathReleaseObject(ctxt->context, cur);
}